

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::MaybeLogToStderr
               (LogSeverity severity,char *message,size_t message_len,size_t prefix_len)

{
  char *tag;
  size_t prefix_len_local;
  size_t message_len_local;
  char *message_local;
  LogSeverity severity_local;
  
  if ((fLI::FLAGS_stderrthreshold <= (int)severity) || ((fLB::FLAGS_alsologtostderr & 1) != 0)) {
    ColoredWriteToStderr(severity,message,message_len);
    tag = glog_internal_namespace_::ProgramInvocationShortName();
    glog_internal_namespace_::AlsoErrorWrite(severity,tag,message + prefix_len);
  }
  return;
}

Assistant:

inline void LogDestination::MaybeLogToStderr(LogSeverity severity,
                                             const char* message,
                                             size_t message_len,
                                             size_t prefix_len) {
  if ((severity >= FLAGS_stderrthreshold) || FLAGS_alsologtostderr) {
    ColoredWriteToStderr(severity, message, message_len);
    AlsoErrorWrite(severity,
                   glog_internal_namespace_::ProgramInvocationShortName(),
                   message + prefix_len);
  }
}